

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  double precision;
  double recall;
  Mat matOutput;
  arguments_t args;
  Mat matTruth;
  string local_200;
  double local_1e0;
  string local_1d8 [3];
  arguments_t local_178;
  string local_130 [16];
  long local_120;
  Mat local_d0 [96];
  Mat local_70 [96];
  
  arguments_t::arguments_t(&local_178,argc,argv);
  sVar1 = arguments_t::parametersSize(&local_178);
  if (sVar1 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080a8);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," truth binary_image",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  else {
    arguments_t::operator[][abi_cxx11_(local_1d8,&local_178,0);
    cv::imread(local_130,(int)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
      operator_delete(local_1d8[0]._M_dataplus._M_p);
    }
    if (local_120 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot load ",0xc);
      arguments_t::operator[][abi_cxx11_(local_1d8,&local_178,0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1d8[0]._M_dataplus._M_p,
                          local_1d8[0]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
        operator_delete(local_1d8[0]._M_dataplus._M_p);
      }
    }
    else {
      arguments_t::operator[][abi_cxx11_(&local_200,&local_178,1);
      cv::imread((string *)local_1d8,(int)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if (local_1d8[0].field_2._M_allocated_capacity == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot load ",0xc)
        ;
        arguments_t::operator[][abi_cxx11_(&local_200,&local_178,1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_200._M_dataplus._M_p,
                            local_200._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
      }
      else {
        cv::Mat::Mat(local_70,(Mat *)local_130);
        cv::Mat::Mat(local_d0,(Mat *)local_1d8);
        score(local_70,local_d0,1,(double *)&local_200,&local_1e0);
        cv::Mat::~Mat(local_d0);
        cv::Mat::~Mat(local_70);
        poVar3 = std::ostream::_M_insert<double>(local_1e0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      cv::Mat::~Mat((Mat *)local_1d8);
    }
    cv::Mat::~Mat((Mat *)local_130);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.parameters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_178);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	arguments_t args(argc, argv);

	if (args.parametersSize() < 2) {
		std::cout << "usage: " << argv[0] << " truth binary_image" << std::endl;
		return 0;
	}

	cv::Mat matTruth = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
	if (!matTruth.data) {
		std::cout << "Cannot load " << args[0] << std::endl;
		return 0;
	}

	cv::Mat matOutput = cv::imread(args[1], cv::IMREAD_GRAYSCALE);
	if (!matOutput.data) {
		std::cout << "Cannot load " << args[1] << std::endl;
		return 0;
	}

	double precision, recall;
	score(matTruth, matOutput, 1, precision, recall);

	std::cout << recall << std::endl;

	return 0;
}